

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_bonsai_trie.hpp
# Opt level: O3

uint64_t __thiscall
poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::find_child
          (plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *this,uint64_t node_id,uint64_t symb)

{
  uint64_t uVar1;
  pointer puVar2;
  byte bVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  if (this->size_ == 0) {
    return 0xffffffffffffffff;
  }
  uVar1 = (this->table_).width_;
  puVar2 = (this->table_).chunks_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar6 = node_id << ((ulong)(byte)(this->symb_size_).bits_ & 0x3f) | symb;
  uVar5 = (uVar6 >> 0x1e ^ uVar6) * -0x40a7b892e31b1a47;
  uVar5 = (uVar5 >> 0x1b ^ uVar5) * -0x6b2fb644ecceee15;
  uVar5 = uVar5 >> 0x1f ^ uVar5;
  do {
    uVar5 = uVar5 & (this->capa_size_).mask_;
    if (1 < uVar5) {
      uVar4 = uVar1 * uVar5;
      uVar8 = (ulong)((uint)uVar4 & 0x3f);
      uVar7 = puVar2[uVar4 >> 6];
      if (uVar8 + uVar1 < 0x41) {
        uVar7 = uVar7 >> uVar8;
      }
      else {
        bVar3 = (byte)uVar4 & 0x3f;
        uVar7 = uVar7 >> bVar3 | puVar2[(uVar4 >> 6) + 1] << 0x40 - bVar3;
      }
      uVar7 = uVar7 & (this->table_).mask_;
      if (uVar7 == 0) {
        return 0xffffffffffffffff;
      }
      if (uVar7 == uVar6) {
        return uVar5;
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

uint64_t find_child(uint64_t node_id, uint64_t symb) const {
        assert(node_id < capa_size_.size());
        assert(symb < symb_size_.size());

        if (size_ == 0) {
            return nil_id;
        }

        uint64_t key = make_key_(node_id, symb);
        assert(key != 0);

        for (uint64_t i = Hasher::hash(key) & capa_size_.mask();; i = right_(i)) {
            if (i == 0) {
                // table_[0] is always empty so that table_[i] = 0 indicates to be empty.
                continue;
            }
            if (i == get_root()) {
                continue;
            }
            if (table_[i] == 0) {
                // encounter an empty slot
                return nil_id;
            }
            if (table_[i] == key) {
                return i;
            }
        }
    }